

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O3

void __thiscall
duckdb::WindowSegmentTreeState::Evaluate
          (WindowSegmentTreeState *this,WindowSegmentTreeGlobalState *gtstate,DataChunk *bounds,
          Vector *result,idx_t count,idx_t row_idx)

{
  WindowExcludeMode WVar1;
  _Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false> this_00;
  WindowSegmentTreePart *this_01;
  undefined8 uVar2;
  const_reference pvVar3;
  _Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false> this_02;
  pointer pWVar4;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> this_03;
  type other;
  idx_t *piVar5;
  idx_t *ends;
  AggregateObject *this_04;
  idx_t *begins;
  ValidityArray *count_00;
  idx_t *ends_00;
  undefined1 local_80 [16];
  undefined1 local_70 [48];
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> local_40;
  Vector *local_38;
  
  local_70._32_8_ = row_idx;
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  local_70._24_8_ = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  local_70._16_8_ = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  local_70._40_8_ = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  begins = (idx_t *)pvVar3->data;
  this_04 = (AggregateObject *)&this->part;
  local_38 = result;
  if ((this->part).
      super_unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl ==
      (WindowSegmentTreePart *)0x0) {
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator->
              (&(this->super_WindowAggregatorLocalState).cursor);
    WindowCursor::Copy((WindowCursor *)local_70);
    this_02._M_head_impl = (WindowSegmentTreePart *)operator_new(0x1f8);
    local_80._0_8_ = local_70._0_8_;
    local_70._0_8_ = (WindowSegmentTreePart *)0x0;
    local_80._8_8_ = &this->part;
    WindowSegmentTreePart::WindowSegmentTreePart
              (this_02._M_head_impl,
               &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator,
               &(gtstate->super_WindowAggregatorGlobalState).aggr,
               (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               local_80,&(gtstate->super_WindowAggregatorGlobalState).filter_mask);
    if ((WindowSegmentTreePart *)local_80._0_8_ != (WindowSegmentTreePart *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)local_80,(WindowCursor *)local_80._0_8_);
    }
    this_00._M_head_impl =
         (((_Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
            *)&(((AggregateFunction *)local_80._8_8_)->super_BaseScalarFunction).
               super_SimpleFunction.super_Function._vptr_Function)->
         super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>)._M_head_impl;
    (((_Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
       *)&(((AggregateFunction *)local_80._8_8_)->super_BaseScalarFunction).super_SimpleFunction.
          super_Function._vptr_Function)->
    super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>)._M_head_impl =
         this_02._M_head_impl;
    if (this_00._M_head_impl != (WindowSegmentTreePart *)0x0) {
      WindowSegmentTreePart::~WindowSegmentTreePart(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl);
    }
    this_04 = (AggregateObject *)local_80._8_8_;
    if ((WindowSegmentTreePart *)local_70._0_8_ != (WindowSegmentTreePart *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)local_70,(WindowCursor *)local_70._0_8_);
      this_04 = (AggregateObject *)local_80._8_8_;
    }
  }
  piVar5 = (idx_t *)local_70._40_8_;
  WVar1 = ((gtstate->super_WindowAggregatorGlobalState).aggregator)->exclude_mode;
  local_70._8_8_ = count;
  if (WVar1 == NO_OTHER) {
    pWVar4 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                           *)this_04);
    count_00 = (ValidityArray *)local_70._8_8_;
    WindowSegmentTreePart::Evaluate
              (pWVar4,gtstate,(idx_t *)local_70._24_8_,(idx_t *)local_70._16_8_,(idx_t *)0x0,
               (Vector *)row_idx,local_70._8_8_,local_70._32_8_,FULL);
  }
  else {
    ends_00 = (idx_t *)local_70._40_8_;
    if (WVar1 == CURRENT_ROW) {
      ends_00 = begins;
    }
    local_80._8_8_ = this;
    pWVar4 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                           *)this_04);
    ends = (idx_t *)local_70._16_8_;
    count_00 = (ValidityArray *)local_70._8_8_;
    WindowSegmentTreePart::Evaluate
              (pWVar4,gtstate,(idx_t *)local_70._24_8_,ends_00,(idx_t *)local_70._16_8_,
               (Vector *)row_idx,local_70._8_8_,local_70._32_8_,LEFT);
    this_03._M_head_impl =
         (WindowCursor *)
         &(((AggregateFunction *)local_80._8_8_)->super_BaseScalarFunction).super_SimpleFunction.
          original_arguments;
    if ((((AggregateFunction *)local_80._8_8_)->super_BaseScalarFunction).super_SimpleFunction.
        original_arguments.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      local_80._8_8_ = this_04;
      unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
      ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                    *)this_04);
      WindowSegmentTreePart::Copy((WindowSegmentTreePart *)local_80);
      uVar2 = local_80._0_8_;
      local_80._0_8_ = (_Head_base<0UL,_duckdb::WindowCursor_*,_false>)0x0;
      this_01 = (WindowSegmentTreePart *)
                (((vector<duckdb::LogicalType,_true> *)this_03._M_head_impl)->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (((vector<duckdb::LogicalType,_true> *)this_03._M_head_impl)->
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)uVar2;
      piVar5 = (idx_t *)local_70._40_8_;
      ends = (idx_t *)local_70._16_8_;
      count_00 = (ValidityArray *)local_70._8_8_;
      this_04 = (AggregateObject *)local_80._8_8_;
      local_40._M_head_impl = this_03._M_head_impl;
      if (this_01 != (WindowSegmentTreePart *)0x0) {
        WindowSegmentTreePart::~WindowSegmentTreePart(this_01);
        operator_delete(this_01);
        uVar2 = local_80._0_8_;
        this_03._M_head_impl = local_40._M_head_impl;
        piVar5 = (idx_t *)local_70._40_8_;
        ends = (idx_t *)local_70._16_8_;
        count_00 = (ValidityArray *)local_70._8_8_;
        this_04 = (AggregateObject *)local_80._8_8_;
        if ((WindowSegmentTreePart *)local_80._0_8_ != (WindowSegmentTreePart *)0x0) {
          WindowSegmentTreePart::~WindowSegmentTreePart((WindowSegmentTreePart *)local_80._0_8_);
          operator_delete((void *)uVar2);
          this_03._M_head_impl = local_40._M_head_impl;
          piVar5 = (idx_t *)local_70._40_8_;
          ends = (idx_t *)local_70._16_8_;
          count_00 = (ValidityArray *)local_70._8_8_;
          this_04 = (AggregateObject *)local_80._8_8_;
        }
      }
    }
    if (WVar1 == CURRENT_ROW) {
      begins = piVar5;
    }
    pWVar4 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                           *)this_03._M_head_impl);
    WindowSegmentTreePart::Evaluate
              (pWVar4,gtstate,begins,ends,(idx_t *)local_70._24_8_,(Vector *)row_idx,(idx_t)count_00
               ,local_70._32_8_,RIGHT);
    pWVar4 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                           *)this_04);
    other = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
            ::operator*((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                         *)this_03._M_head_impl);
    WindowSegmentTreePart::Combine(pWVar4,other,(idx_t)count_00);
  }
  pWVar4 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
           ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                         *)this_04);
  WindowSegmentTreePart::Finalize(pWVar4,local_38,(idx_t)count_00);
  return;
}

Assistant:

void WindowSegmentTreeState::Evaluate(const WindowSegmentTreeGlobalState &gtstate, const DataChunk &bounds,
                                      Vector &result, idx_t count, idx_t row_idx) {
	auto window_begin = FlatVector::GetData<const idx_t>(bounds.data[FRAME_BEGIN]);
	auto window_end = FlatVector::GetData<const idx_t>(bounds.data[FRAME_END]);
	auto peer_begin = FlatVector::GetData<const idx_t>(bounds.data[PEER_BEGIN]);
	auto peer_end = FlatVector::GetData<const idx_t>(bounds.data[PEER_END]);

	if (!part) {
		part = make_uniq<WindowSegmentTreePart>(allocator, gtstate.aggr, cursor->Copy(), gtstate.filter_mask);
	}

	if (gtstate.aggregator.exclude_mode != WindowExcludeMode::NO_OTHER) {
		// If we exclude the current row, then both left and right need to contain it.
		const bool exclude_current = gtstate.aggregator.exclude_mode == WindowExcludeMode::CURRENT_ROW;

		// 1. evaluate the tree left of the excluded part
		auto middle = exclude_current ? peer_end : peer_begin;
		part->Evaluate(gtstate, window_begin, middle, window_end, result, count, row_idx, WindowSegmentTreePart::LEFT);

		// 2. set up a second state for the right of the excluded part
		if (!right_part) {
			right_part = part->Copy();
		}

		// 3. evaluate the tree right of the excluded part
		middle = exclude_current ? peer_begin : peer_end;
		right_part->Evaluate(gtstate, middle, window_end, window_begin, result, count, row_idx,
		                     WindowSegmentTreePart::RIGHT);

		// 4. combine the buffer state into the Segment Tree State
		part->Combine(*right_part, count);
	} else {
		part->Evaluate(gtstate, window_begin, window_end, nullptr, result, count, row_idx, WindowSegmentTreePart::FULL);
	}

	part->Finalize(result, count);
}